

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O3

int yaml_emitter_check_simple_key(yaml_emitter_t *emitter)

{
  yaml_event_t *pyVar1;
  ulong uVar2;
  
  pyVar1 = (emitter->events).head;
  switch(pyVar1->type) {
  case YAML_ALIAS_EVENT:
    uVar2 = (emitter->anchor_data).anchor_length;
    goto LAB_0010a5fb;
  case YAML_SCALAR_EVENT:
    if ((emitter->scalar_data).multiline != 0) {
      return 0;
    }
    uVar2 = (emitter->tag_data).handle_length + (emitter->anchor_data).anchor_length +
            (emitter->tag_data).suffix_length + (emitter->scalar_data).length;
    goto LAB_0010a5fb;
  case YAML_SEQUENCE_START_EVENT:
    if ((long)(emitter->events).tail - (long)pyVar1 < 0xd0) {
      return 0;
    }
    if (pyVar1[1].type != YAML_SEQUENCE_END_EVENT) {
      return 0;
    }
    break;
  default:
    return 0;
  case YAML_MAPPING_START_EVENT:
    if ((long)(emitter->events).tail - (long)pyVar1 < 0xd0) {
      return 0;
    }
    if (pyVar1[1].type != YAML_MAPPING_END_EVENT) {
      return 0;
    }
  }
  uVar2 = (emitter->tag_data).handle_length + (emitter->anchor_data).anchor_length +
          (emitter->tag_data).suffix_length;
LAB_0010a5fb:
  return (int)(uVar2 < 0x81);
}

Assistant:

static int
yaml_emitter_check_simple_key(yaml_emitter_t *emitter)
{
    yaml_event_t *event = emitter->events.head;
    size_t length = 0;

    switch (event->type)
    {
        case YAML_ALIAS_EVENT:
            length += emitter->anchor_data.anchor_length;
            break;

        case YAML_SCALAR_EVENT:
            if (emitter->scalar_data.multiline)
                return 0;
            length += emitter->anchor_data.anchor_length
                + emitter->tag_data.handle_length
                + emitter->tag_data.suffix_length
                + emitter->scalar_data.length;
            break;

        case YAML_SEQUENCE_START_EVENT:
            if (!yaml_emitter_check_empty_sequence(emitter))
                return 0;
            length += emitter->anchor_data.anchor_length
                + emitter->tag_data.handle_length
                + emitter->tag_data.suffix_length;
            break;

        case YAML_MAPPING_START_EVENT:
            if (!yaml_emitter_check_empty_mapping(emitter))
                return 0;
            length += emitter->anchor_data.anchor_length
                + emitter->tag_data.handle_length
                + emitter->tag_data.suffix_length;
            break;

        default:
            return 0;
    }

    if (length > 128)
        return 0;

    return 1;
}